

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_dirt.cc
# Opt level: O0

void __thiscall FilesystemDirt::AddDirtyPath(FilesystemDirt *this,string *path)

{
  ulong uVar1;
  long lVar2;
  pointer ppVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_bool>
  pVar4;
  FilesystemDirt local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>
  local_108;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
  local_b0;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>,_bool>
  child;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  string remainder;
  string first;
  size_t slash;
  size_t nonslash;
  string *path_local;
  FilesystemDirt *this_local;
  
  if ((this->dirty_ & 1U) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      uVar1 = std::__cxx11::string::find_first_not_of((char)path,0x2f);
      lVar2 = std::__cxx11::string::find((char)path,0x2f);
      std::__cxx11::string::string
                ((string *)(remainder.field_2._M_local_buf + 8),(string *)path,uVar1,lVar2 - uVar1);
      std::__cxx11::string::string((string *)local_68);
      if (lVar2 != -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,(string *)path,lVar2 + 1,&local_89);
        std::__cxx11::string::operator=((string *)local_68,local_88);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
      }
      FilesystemDirt(&local_140);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FilesystemDirt,_true>
                (&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&remainder.field_2 + 8),&local_140);
      pVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
              ::insert(&this->children_,&local_108);
      local_b0 = pVar4.first._M_node;
      child.first._M_node._0_1_ = pVar4.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>
      ::~pair(&local_108);
      ~FilesystemDirt(&local_140);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>
               ::operator->(&local_b0);
      AddDirtyPath(&ppVar3->second,(string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
      std::__cxx11::string::~string((string *)(remainder.field_2._M_local_buf + 8));
    }
    else {
      this->dirty_ = true;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FilesystemDirt>_>_>
      ::clear(&this->children_);
    }
  }
  return;
}

Assistant:

void FilesystemDirt::AddDirtyPath(const std::string& path) {
  if (!dirty_) {
    if (path.empty()) {
      // No further pathname components. Mark this file dirty.
      dirty_ = true;
      children_.clear();
    } else {
      // Extract first pathname component from input path.
      std::size_t nonslash = path.find_first_not_of('/');
      std::size_t slash = path.find('/', nonslash);
      std::string first(path, nonslash, slash - nonslash);
      std::string remainder;
      if (slash != std::string::npos)
        remainder = std::string(path, slash + 1);

      // Continue to next pathname component.
      auto child = children_.insert({first, FilesystemDirt()});
      child.first->second.AddDirtyPath(remainder);
    }
  }
}